

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  int iVar1;
  char *pcVar2;
  sqlite3 *in_RDX;
  byte *in_RSI;
  int n;
  u64 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint uVar3;
  byte *local_10;
  
  local_10 = in_RSI;
  while ((""[*local_10] & 1) != 0) {
    local_10 = local_10 + 1;
  }
  iVar1 = (int)in_RDX - (int)local_10;
  while( true ) {
    uVar3 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (0 < iVar1) {
      uVar3 = CONCAT13((""[local_10[iVar1 + -1]] & 1) != 0,(int3)in_stack_ffffffffffffffe0);
    }
    if ((char)(uVar3 >> 0x18) == '\0') break;
    iVar1 = iVar1 + -1;
    in_stack_ffffffffffffffe0 = uVar3;
  }
  pcVar2 = sqlite3DbStrNDup(in_RDX,(char *)CONCAT44(iVar1,uVar3),in_stack_ffffffffffffffd8);
  return pcVar2;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( ALWAYS(n>0) && sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}